

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O0

void __thiscall
TPZSkylNSymMatrix<std::complex<double>_>::Read
          (TPZSkylNSymMatrix<std::complex<double>_> *this,TPZStream *buf,void *context)

{
  int64_t iVar1;
  int64_t iVar2;
  int *piVar3;
  complex<double> **ppcVar4;
  TPZBaseMatrix *in_RDI;
  int64_t i;
  complex<double> *ptr2;
  complex<double> *ptr;
  TPZVec<int> skyl2;
  TPZVec<int> skyl;
  TPZVec<std::complex<double>_> *in_stack_fffffffffffffee8;
  complex<double> *pcVar5;
  TPZVec<int> *in_stack_fffffffffffffef0;
  TPZStream *in_stack_fffffffffffffef8;
  TPZBaseMatrix *in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff18;
  TPZVec<std::complex<double>_*> *in_stack_ffffffffffffff20;
  int64_t local_88;
  complex<double> *local_80;
  complex<double> *local_78;
  TPZVec<int> local_60;
  undefined4 local_3c;
  TPZVec<int> local_38;
  
  TPZBaseMatrix::Read(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0)
  ;
  TPZStream::Read<std::complex<double>>
            ((TPZStream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  TPZStream::Read<std::complex<double>>
            ((TPZStream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  TPZBaseMatrix::Rows(in_RDI);
  local_3c = 0;
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_ffffffffffffff00,(int64_t)in_stack_fffffffffffffef8,
                      (int *)in_stack_fffffffffffffef0);
  TPZBaseMatrix::Rows(in_RDI);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_ffffffffffffff00,(int64_t)in_stack_fffffffffffffef8,
                      (int *)in_stack_fffffffffffffef0);
  TPZStream::Read<int>
            ((TPZStream *)in_stack_fffffffffffffef0,(TPZVec<int> *)in_stack_fffffffffffffee8);
  TPZStream::Read<int>
            ((TPZStream *)in_stack_fffffffffffffef0,(TPZVec<int> *)in_stack_fffffffffffffee8);
  local_78 = (complex<double> *)0x0;
  local_80 = (complex<double> *)0x0;
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar1 != 0) {
    local_78 = TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)(in_RDI + 3),0);
    local_80 = TPZVec<std::complex<double>_>::operator[]
                         ((TPZVec<std::complex<double>_> *)(in_RDI + 9),0);
  }
  TPZBaseMatrix::Rows(in_RDI);
  TPZVec<std::complex<double>_*>::Resize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZBaseMatrix::Rows(in_RDI);
  TPZVec<std::complex<double>_*>::Resize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_88 = 0;
  while( true ) {
    iVar1 = local_88;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 + 1 <= iVar1) break;
    piVar3 = TPZVec<int>::operator[](&local_38,local_88);
    pcVar5 = local_78 + *piVar3;
    ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RDI + 1),local_88);
    *ppcVar4 = pcVar5;
    piVar3 = TPZVec<int>::operator[](&local_60,local_88);
    pcVar5 = local_80 + *piVar3;
    in_stack_fffffffffffffef0 =
         (TPZVec<int> *)
         TPZVec<std::complex<double>_*>::operator[]
                   ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),local_88);
    in_stack_fffffffffffffef0->_vptr_TPZVec = (_func_int **)pcVar5;
    local_88 = local_88 + 1;
  }
  TPZVec<int>::~TPZVec(in_stack_fffffffffffffef0);
  TPZVec<int>::~TPZVec(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::Read(TPZStream &buf, void *context )
{
	TPZMatrix<TVar>::Read(buf, context);
	buf.Read( fStorage);
	buf.Read( fStorage);
	TPZVec<int> skyl(this->Rows()+1,0), skyl2(this->Rows()+1,0);
	buf.Read( skyl);
	buf.Read( skyl2);
	TVar *ptr = 0, *ptr2 = 0;
	if (this->Rows()) {
		ptr = &fStorage[0];
		ptr2 = &fStorageb[0];
	}
	fElem.Resize(this->Rows()+1);
	fElemb.Resize(this->Rows()+1);
	for (int64_t i=0; i<this->Rows()+1; i++) {
		fElem[i] = skyl[i] + ptr;
		fElemb[i] = skyl2[i] + ptr2;
	}
}